

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsEndpointSendStringTo(HelicsEndpoint endpoint,char *message,char *dest,HelicsError *err)

{
  EndpointObject *pEVar1;
  long in_RDX;
  long in_RSI;
  EndpointObject *endObj;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  HelicsError *in_stack_ffffffffffffff80;
  Endpoint *this;
  char *in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  __sv_type in_stack_ffffffffffffff98;
  __sv_type in_stack_ffffffffffffffa8;
  
  pEVar1 = anon_unknown.dwarf_784a3::verifyEndpoint
                     (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (pEVar1 != (EndpointObject *)0x0) {
    this = pEVar1->endPtr;
    if (in_RSI == 0) {
      in_stack_ffffffffffffffa8 =
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    helics::data_view::data_view<std::basic_string_view<char,std::char_traits<char>>,void>
              ((data_view *)this,in_stack_ffffffffffffff78);
    if (in_RDX == 0) {
      in_stack_ffffffffffffff98 =
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    helics::Endpoint::sendTo
              ((Endpoint *)in_stack_ffffffffffffff98._M_str,
               (data_view *)in_stack_ffffffffffffff98._M_len,in_stack_ffffffffffffffa8);
    helics::data_view::~data_view((data_view *)0x1de461);
  }
  return;
}

Assistant:

void helicsEndpointSendStringTo(HelicsEndpoint endpoint, const char* message, const char* dest, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->sendTo(AS_STRING_VIEW(message), AS_STRING_VIEW(dest));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}